

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O3

void __thiscall Restaurant::goOpen(Restaurant *this,string *details)

{
  pointer *pppBVar1;
  int iVar2;
  pointer ppTVar3;
  iterator __position;
  bool bVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  OpenTable *pOVar8;
  undefined8 uVar9;
  ulong uVar10;
  string delimiterSpace;
  string token1;
  vector<Customer_*,_std::allocator<Customer_*>_> customers;
  Customer *newCustomer;
  string token2;
  string delimiterComa;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  OpenTable *local_108;
  char *local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [24];
  OpenTable *local_d0 [2];
  undefined1 local_c0 [16];
  _Alloc_hider local_b0;
  undefined1 local_a8 [24];
  Customer **local_90 [2];
  Customer *local_80 [2];
  string local_70;
  string local_50;
  
  std::__cxx11::string::_M_assign((string *)&this->newMsg);
  local_e8._0_8_ = (pointer)0x0;
  local_e8._8_8_ = (Customer **)0x0;
  local_e8._16_8_ = (Customer **)0x0;
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128," ","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,",","");
  local_108 = (OpenTable *)local_f8;
  local_100 = (char *)0x0;
  local_f8[0] = 0;
  local_b0._M_p = local_a8 + 8;
  local_a8._0_8_ = (char *)0x0;
  local_a8[8] = '\0';
  std::__cxx11::string::find((char *)details,(ulong)local_128[0],0);
  std::__cxx11::string::substr((ulong)local_d0,(ulong)details);
  std::__cxx11::string::operator=((string *)&local_108,(string *)local_d0);
  if (local_d0[0] != (OpenTable *)local_c0) {
    operator_delete(local_d0[0]);
  }
  pOVar8 = local_108;
  piVar6 = __errno_location();
  iVar2 = *piVar6;
  *piVar6 = 0;
  lVar7 = strtol((char *)pOVar8,(char **)local_d0,10);
  if (local_d0[0] == pOVar8) {
LAB_0010a486:
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar5 = (uint)lVar7;
    if (((int)uVar5 == lVar7) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar2;
      }
      std::__cxx11::string::erase((ulong)details,0);
      lVar7 = std::__cxx11::string::find((char *)details,(ulong)local_128[0],0);
      if ((lVar7 != -1) && (-1 < (int)uVar5)) {
        uVar10 = (ulong)(uVar5 & 0x7fffffff);
        do {
          ppTVar3 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((int)((ulong)((long)(this->tables).
                                   super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppTVar3) >> 3) <
               (int)uVar5) || (ppTVar3[uVar10] == (Table *)0x0)) break;
          std::__cxx11::string::find((char *)details,(ulong)local_90[0],0);
          std::__cxx11::string::substr((ulong)local_d0,(ulong)details);
          std::__cxx11::string::operator=((string *)&local_108,(string *)local_d0);
          if (local_d0[0] != (OpenTable *)local_c0) {
            operator_delete(local_d0[0]);
          }
          std::__cxx11::string::erase((ulong)details,0);
          std::__cxx11::string::find((char *)details,(ulong)local_128[0],0);
          std::__cxx11::string::substr((ulong)local_d0,(ulong)details);
          std::__cxx11::string::operator=((string *)&local_b0,(string *)local_d0);
          if (local_d0[0] != (OpenTable *)local_c0) {
            operator_delete(local_d0[0]);
          }
          std::__cxx11::string::erase((ulong)details,0);
          if ((local_100 != (char *)0x0) && ((char *)local_a8._0_8_ != (char *)0x0)) {
            ppTVar3 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3) <=
                uVar10) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar10);
              goto LAB_0010a486;
            }
            bVar4 = Table::isOpen(ppTVar3[uVar10]);
            if (!bVar4) {
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,local_108,local_100 + (long)local_108);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,local_b0._M_p,local_b0._M_p + local_a8._0_8_);
              pOVar8 = (OpenTable *)createCustomerByType(this,&local_70,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p);
              }
              local_d0[0] = pOVar8;
              if (local_e8._8_8_ == local_e8._16_8_) {
                std::vector<Customer*,std::allocator<Customer*>>::_M_realloc_insert<Customer*const&>
                          ((vector<Customer*,std::allocator<Customer*>> *)local_e8,
                           (iterator)local_e8._8_8_,(Customer **)local_d0);
              }
              else {
                *(OpenTable **)local_e8._8_8_ = pOVar8;
                local_e8._8_8_ = local_e8._8_8_ + 8;
              }
              this->nextCustomerId = this->nextCustomerId + 1;
              std::__cxx11::string::_M_replace((ulong)&local_108,0,local_100,0x10c4df);
              std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)local_a8._0_8_,0x10c4df);
            }
          }
          lVar7 = std::__cxx11::string::find((char *)details,(ulong)local_128[0],0);
        } while (lVar7 != -1);
      }
      pOVar8 = (OpenTable *)operator_new(0x68);
      OpenTable::OpenTable
                (pOVar8,(long)(int)uVar5,(vector<Customer_*,_std::allocator<Customer_*>_> *)local_e8
                );
      (**(pOVar8->super_BaseAction)._vptr_BaseAction)(pOVar8,this);
      __position._M_current =
           (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_d0[0] = pOVar8;
      if (__position._M_current ==
          (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<BaseAction*,std::allocator<BaseAction*>>::_M_realloc_insert<BaseAction*>
                  ((vector<BaseAction*,std::allocator<BaseAction*>> *)&this->actionsLog,__position,
                   (BaseAction **)local_d0);
      }
      else {
        *__position._M_current = (BaseAction *)pOVar8;
        pppBVar1 = &(this->actionsLog).
                    super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
      if (local_b0._M_p != local_a8 + 8) {
        operator_delete(local_b0._M_p);
      }
      if (local_108 != (OpenTable *)local_f8) {
        operator_delete(local_108);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      if (local_128[0] != local_118) {
        operator_delete(local_128[0]);
      }
      if ((pointer)local_e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_e8._0_8_);
      }
      return;
    }
  }
  uVar9 = std::__throw_out_of_range("stoi");
  if (local_b0._M_p != local_a8 + 8) {
    operator_delete(local_b0._M_p);
  }
  if (local_108 != (OpenTable *)local_f8) {
    operator_delete(local_108);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0]);
  }
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._0_8_);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

void Restaurant::goOpen(std::string details)
{
    newMsg = details;
    std::vector<Customer*> customers;
    int tableId;
    std::string delimiterSpace = " ";
    std::string delimiterComa = ",";
    size_t pos1 = 0;
    std::string token1;
    std::string token2;
    pos1 = details.find(delimiterSpace);
    token1 = details.substr(0,pos1);
    tableId = std::stoi(token1);//get the id
    details.erase(0, pos1 + delimiterSpace.length());

    //get the customers
    size_t pos2 = 0;
    while((pos2 = details.find(delimiterSpace)) != std::string::npos && getTable(tableId) != nullptr)
    {
        pos2 = details.find(delimiterComa);
        token1 = details.substr(0, pos2);
        details.erase(0, pos2 + delimiterComa.length());
        pos2 = details.find(delimiterSpace);
        token2 = details.substr(0, pos2);
        details.erase(0, pos2 + delimiterSpace.length());
        if(!token1.empty() && !token2.empty() && !tables.at(static_cast<unsigned long>(tableId))->isOpen())
        {
            Customer *newCustomer = createCustomerByType(token1, token2);
            customers.push_back(newCustomer);
            nextCustomerId++;
            token1="";
            token2="";
        }
    }
    auto open = new OpenTable(static_cast<unsigned long>(tableId), customers);
    open->act(*this);
    actionsLog.push_back(open);
}